

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_intersection.cc
# Opt level: O2

bool __thiscall S2RegionIntersection::Contains(S2RegionIntersection *this,S2Point *p)

{
  pointer puVar1;
  __uniq_ptr_impl<S2Region,_std::default_delete<S2Region>_> _Var2;
  long lVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    puVar1 = (this->regions_).
             super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(int)((ulong)((long)(this->regions_).
                                      super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >>
                       3);
    if (lVar6 <= lVar5) break;
    _Var2._M_t.super__Tuple_impl<0UL,_S2Region_*,_std::default_delete<S2Region>_>.
    super__Head_base<0UL,_S2Region_*,_false>._M_head_impl =
         puVar1[lVar5]._M_t.super___uniq_ptr_impl<S2Region,_std::default_delete<S2Region>_>._M_t;
    cVar4 = (**(code **)(*(long *)_Var2._M_t.
                                  super__Tuple_impl<0UL,_S2Region_*,_std::default_delete<S2Region>_>
                                  .super__Head_base<0UL,_S2Region_*,_false>._M_head_impl + 0x40))
                      (_Var2._M_t.super__Tuple_impl<0UL,_S2Region_*,_std::default_delete<S2Region>_>
                       .super__Head_base<0UL,_S2Region_*,_false>._M_head_impl,p);
    lVar3 = lVar5 + 1;
  } while (cVar4 != '\0');
  return lVar6 <= lVar5;
}

Assistant:

bool S2RegionIntersection::Contains(const S2Point& p) const {
  for (int i = 0; i < num_regions(); ++i) {
    if (!region(i)->Contains(p)) return false;
  }
  return true;
}